

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O2

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_arc
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,double x,double y,double dx1,double dy1,
          double dx2,double dy2)

{
  int iVar1;
  int iVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  __x = atan2((double)this->m_width_sign * dy1,(double)this->m_width_sign * dx1);
  dVar3 = atan2((double)this->m_width_sign * dy2,(double)this->m_width_sign * dx2);
  dVar4 = acos(this->m_width_abs / (0.125 / this->m_approx_scale + this->m_width_abs));
  add_vertex(this,vc,dx1 + x,dy1 + y);
  if (this->m_width_sign < 1) {
    dVar3 = __x - (double)(~-(ulong)(__x < dVar3) & (ulong)dVar3 |
                          (ulong)(dVar3 + -6.283185307179586) & -(ulong)(__x < dVar3));
    iVar1 = (int)(dVar3 / (dVar4 + dVar4));
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    while (iVar2 != 0) {
      __x = __x - dVar3 / (double)(iVar1 + 1);
      dVar5 = cos(__x);
      dVar4 = this->m_width;
      dVar6 = sin(__x);
      add_vertex(this,vc,dVar5 * dVar4 + x,dVar6 * this->m_width + y);
      iVar2 = iVar2 + -1;
    }
  }
  else {
    dVar3 = (double)(~-(ulong)(dVar3 < __x) & (ulong)dVar3 |
                    (ulong)(dVar3 + 6.283185307179586) & -(ulong)(dVar3 < __x)) - __x;
    iVar1 = (int)(dVar3 / (dVar4 + dVar4));
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    while (iVar2 != 0) {
      __x = __x + dVar3 / (double)(iVar1 + 1);
      dVar5 = cos(__x);
      dVar4 = this->m_width;
      dVar6 = sin(__x);
      add_vertex(this,vc,dVar5 * dVar4 + x,dVar6 * this->m_width + y);
      iVar2 = iVar2 + -1;
    }
  }
  add_vertex(this,vc,x + dx2,y + dy2);
  return;
}

Assistant:

void math_stroke<VC>::calc_arc(VC& vc,
                                   double x,   double y, 
                                   double dx1, double dy1, 
                                   double dx2, double dy2)
    {
        double a1 = atan2(dy1 * m_width_sign, dx1 * m_width_sign);
        double a2 = atan2(dy2 * m_width_sign, dx2 * m_width_sign);
        double da = a1 - a2;
        int i, n;

        da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;

        add_vertex(vc, x + dx1, y + dy1);
        if(m_width_sign > 0)
        {
            if(a1 > a2) a2 += 2 * pi;
            n = int((a2 - a1) / da);
            da = (a2 - a1) / (n + 1);
            a1 += da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 += da;
            }
        }
        else
        {
            if(a1 < a2) a2 -= 2 * pi;
            n = int((a1 - a2) / da);
            da = (a1 - a2) / (n + 1);
            a1 -= da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 -= da;
            }
        }
        add_vertex(vc, x + dx2, y + dy2);
    }